

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O2

void __thiscall
tvm::runtime::TVMRetValue::MoveToCHost
          (TVMRetValue *this,TVMValue_conflict *ret_value,int *ret_type_code)

{
  ostream *poVar1;
  LogMessageFatal LStack_1a8;
  
  if ((this->super_TVMPODValue_).type_code_ - 0xbU < 2) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&LStack_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
               ,0x30f);
    poVar1 = std::operator<<((ostream *)&LStack_1a8,
                             "Check failed: type_code_ != kStr && type_code_ != kBytes");
    std::operator<<(poVar1,": ");
    dmlc::LogMessageFatal::~LogMessageFatal(&LStack_1a8);
  }
  ret_value->v_ctx = (TVMContext)(this->super_TVMPODValue_).value_;
  *ret_type_code = (this->super_TVMPODValue_).type_code_;
  (this->super_TVMPODValue_).type_code_ = 4;
  return;
}

Assistant:

void MoveToCHost(TVMValue *ret_value,
                   int *ret_type_code) {
    // cannot move str; need specially handle.
    CHECK(type_code_ != kStr && type_code_ != kBytes);
    *ret_value = value_;
    *ret_type_code = type_code_;
    type_code_ = kNull;
  }